

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxPow::Emit(FxPow *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  ExpEmit EVar2;
  undefined4 extraout_var;
  ExpEmit EVar3;
  bool bVar4;
  int local_54;
  byte local_31;
  ExpEmit local_30;
  ExpEmit op2;
  ExpEmit op1;
  VMFunctionBuilder *build_local;
  FxPow *this_local;
  ExpEmit to;
  undefined4 extraout_var_00;
  
  pFVar1 = (this->super_FxBinary).left;
  op2._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  op2.Konst = (bool)(char)extraout_var;
  op2.Fixed = (bool)(char)((uint)extraout_var >> 8);
  op2.Final = (bool)(char)((uint)extraout_var >> 0x10);
  op2.Target = (bool)(char)((uint)extraout_var >> 0x18);
  pFVar1 = (this->super_FxBinary).right;
  EVar3._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  EVar3.Konst = (bool)(char)extraout_var_00;
  EVar3.Fixed = (bool)(char)((uint)extraout_var_00 >> 8);
  EVar3.Final = (bool)(char)((uint)extraout_var_00 >> 0x10);
  EVar3.Target = (bool)(char)((uint)extraout_var_00 >> 0x18);
  local_31 = 1;
  if (((ulong)op2 & 0x100000000) != 0) {
    local_30.Konst = SUB41(extraout_var_00,0);
    local_31 = local_30.Konst ^ 0xff;
  }
  local_30 = EVar3;
  if ((local_31 & 1) == 0) {
    __assert_fail("!op1.Konst || !op2.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xc10,"virtual ExpEmit FxPow::Emit(VMFunctionBuilder *)");
  }
  ExpEmit::Free(&op2,build);
  ExpEmit::Free(&local_30,build);
  bVar4 = false;
  if (op2.RegType == '\x01') {
    bVar4 = local_30.RegType == '\x01';
  }
  if (bVar4) {
    ExpEmit::ExpEmit((ExpEmit *)&this_local,build,1,1);
    if (((ulong)op2 & 0x100000000) == 0) {
      local_54 = 0xa4;
      if (((ulong)local_30 & 0x100000000) != 0) {
        local_54 = 0xa5;
      }
    }
    else {
      local_54 = 0xa6;
    }
    VMFunctionBuilder::Emit
              (build,local_54,(uint)(ushort)this_local,(uint)op2.RegNum,(uint)local_30.RegNum);
    EVar2.RegType = this_local._2_1_;
    EVar2.RegCount = this_local._3_1_;
    EVar2.Konst = (bool)this_local._4_1_;
    EVar2.Fixed = (bool)this_local._5_1_;
    EVar2.Final = (bool)this_local._6_1_;
    EVar2.Target = (bool)this_local._7_1_;
    EVar2.RegNum = (ushort)this_local;
    return EVar2;
  }
  __assert_fail("op1.RegType == REGT_FLOAT && op2.RegType == REGT_FLOAT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0xc13,"virtual ExpEmit FxPow::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxPow::Emit(VMFunctionBuilder *build)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);

	// Pow is not commutative, so either side may be constant (but not both).
	assert(!op1.Konst || !op2.Konst);
	op1.Free(build);
	op2.Free(build);
	assert(op1.RegType == REGT_FLOAT && op2.RegType == REGT_FLOAT);
	ExpEmit to(build, REGT_FLOAT);
	build->Emit((op1.Konst ? OP_POWF_KR : op2.Konst ? OP_POWF_RK : OP_POWF_RR),	to.RegNum, op1.RegNum, op2.RegNum);
	return to;
}